

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int finishbinexpneg(FuncState *fs,expdesc *e1,expdesc *e2,OpCode op,int line,TMS event)

{
  lua_Integer i;
  int iVar1;
  int v2;
  lua_Integer i2;
  TMS event_local;
  int line_local;
  OpCode op_local;
  expdesc *e2_local;
  expdesc *e1_local;
  FuncState *fs_local;
  
  iVar1 = luaK_isKint(e2);
  if (iVar1 != 0) {
    i = (e2->u).ival;
    iVar1 = fitsC(i);
    if ((iVar1 != 0) && (iVar1 = fitsC(-i), iVar1 != 0)) {
      finishbinexpval(fs,e1,e2,op,0x7f - (int)i,0,line,OP_MMBINI,event);
      fs->f->code[fs->pc + -1] =
           fs->f->code[fs->pc + -1] & 0xff00ffff | ((int)i + 0x7fU & 0xff) << 0x10;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int finishbinexpneg (FuncState *fs, expdesc *e1, expdesc *e2,
                             OpCode op, int line, TMS event) {
  if (!luaK_isKint(e2))
    return 0;  /* not an integer constant */
  else {
    lua_Integer i2 = e2->u.ival;
    if (!(fitsC(i2) && fitsC(-i2)))
      return 0;  /* not in the proper range */
    else {  /* operating a small integer constant */
      int v2 = cast_int(i2);
      finishbinexpval(fs, e1, e2, op, int2sC(-v2), 0, line, OP_MMBINI, event);
      /* correct metamethod argument */
      SETARG_B(fs->f->code[fs->pc - 1], int2sC(v2));
      return 1;  /* successfully coded */
    }
  }
}